

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O1

void __thiscall YAML::Scanner::ScanFlowStart(Scanner *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined8 uVar3;
  _Elt_pointer pFVar4;
  char cVar5;
  FLOW_MARKER flowType;
  FLOW_MARKER local_7c;
  Token local_78;
  
  InsertPotentialSimpleKey(this);
  this->m_simpleKeyAllowed = true;
  this->m_canBeJSONFlow = false;
  uVar3._0_4_ = (this->INPUT).m_mark.pos;
  uVar3._4_4_ = (this->INPUT).m_mark.line;
  iVar2 = (this->INPUT).m_mark.column;
  cVar5 = YAML::Stream::get(&this->INPUT);
  local_7c = (FLOW_MARKER)(cVar5 == '[');
  pFVar4 = (this->m_flows).c.
           super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pFVar4 == (this->m_flows).c.
                super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<YAML::Scanner::FLOW_MARKER,std::allocator<YAML::Scanner::FLOW_MARKER>>::
    _M_push_back_aux<YAML::Scanner::FLOW_MARKER_const&>
              ((deque<YAML::Scanner::FLOW_MARKER,std::allocator<YAML::Scanner::FLOW_MARKER>> *)
               &this->m_flows,&local_7c);
  }
  else {
    *pFVar4 = local_7c;
    (this->m_flows).c.
    super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_cur = pFVar4 + 1;
  }
  local_78.type = local_7c == FLOW_SEQ ^ FLOW_MAP_START;
  paVar1 = &local_78.value.field_2;
  local_78.status = VALID;
  local_78.value._M_string_length = 0;
  local_78.value.field_2._M_local_buf[0] = '\0';
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_78._76_8_ = 0;
  local_78.mark._0_8_ = uVar3;
  local_78.mark.column = iVar2;
  local_78.value._M_dataplus._M_p = (pointer)paVar1;
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
            (&(this->m_tokens).c,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78.params);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.value._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Scanner::ScanFlowStart() {
  // flows can be simple keys
  InsertPotentialSimpleKey();
  m_simpleKeyAllowed = true;
  m_canBeJSONFlow = false;

  // eat
  Mark mark = INPUT.mark();
  char ch = INPUT.get();
  FLOW_MARKER flowType = (ch == Keys::FlowSeqStart ? FLOW_SEQ : FLOW_MAP);
  m_flows.push(flowType);
  Token::TYPE type =
      (flowType == FLOW_SEQ ? Token::FLOW_SEQ_START : Token::FLOW_MAP_START);
  m_tokens.push(Token(type, mark));
}